

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.h
# Opt level: O3

void __thiscall xemmai::portable::t_library::t_library(t_library *this,wstring *a_path)

{
  pointer pwVar1;
  void *pvVar2;
  wchar_t *pwVar3;
  wstring_view a_string;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> __str;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  string local_40;
  
  pwVar1 = (a_path->_M_dataplus)._M_p;
  pwVar3 = (wchar_t *)a_path->_M_string_length;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t*>((wstring *)&local_60,pwVar1,pwVar1 + (long)pwVar3);
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::append
            (&local_60,L".so");
  a_string._M_str = pwVar3;
  a_string._M_len = (size_t)local_60._M_dataplus._M_p;
  f_convert_abi_cxx11_(&local_40,(portable *)local_60._M_string_length,a_string);
  pvVar2 = (void *)dlopen(local_40._M_dataplus._M_p,0x101);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity * 4 + 4);
  }
  this->v_handle = pvVar2;
  return;
}

Assistant:

t_library(const std::wstring& a_path) : v_handle(dlopen(f_convert(a_path + L".so").c_str(), RTLD_LAZY | RTLD_GLOBAL))
	{
//		if (v_handle == NULL) std::fprintf(stderr, "dlopen: %s\n", dlerror());
	}